

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  float fVar3;
  long lVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  bool bVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  int local_6c;
  
  *pResult = 0.0;
  uVar5 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar5 == 1) {
    uVar11 = 1;
    lVar4 = 1;
    pbVar6 = (byte *)z;
  }
  else {
    for (lVar4 = (long)(int)(3 - uVar5); (lVar4 < length && (z[lVar4] == '\0')); lVar4 = lVar4 + 2)
    {
    }
    uVar11 = (uint)(length <= lVar4);
    length = (uint)lVar4 ^ 1;
    pbVar6 = (byte *)(z + (uVar5 & 1));
    lVar4 = 2;
  }
  pbVar9 = (byte *)(z + length);
  while( true ) {
    if (pbVar9 <= pbVar6) {
      return 0;
    }
    bVar1 = *pbVar6;
    if ((""[bVar1] & 1) == 0) break;
    pbVar6 = pbVar6 + lVar4;
  }
  lVar10 = 0;
  lVar8 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar8 = lVar4;
  }
  pbVar13 = pbVar6 + lVar8;
  pbVar6 = pbVar6 + lVar8 + lVar4;
  iVar12 = 0;
  for (; ((pbVar13 < pbVar9 && (bVar2 = *pbVar13, (ulong)bVar2 - 0x30 < 10)) &&
         (lVar10 < 0xccccccccccccccb)); lVar10 = lVar10 * 10 + (long)(char)bVar2 + -0x30) {
    pbVar13 = pbVar13 + lVar4;
    iVar12 = iVar12 + 1;
    pbVar6 = pbVar6 + lVar4;
  }
  iVar16 = 0;
  for (; pbVar13 < pbVar9; pbVar13 = pbVar13 + lVar4) {
    if ((ulong)*pbVar13 - 0x3a < 0xfffffffffffffff6) {
      iVar12 = iVar12 + iVar16;
      if (*pbVar13 == 0x2e) {
        for (; (pbVar13 = pbVar6, pbVar6 < pbVar9 && (0xfffffffffffffff5 < (ulong)*pbVar6 - 0x3a));
            pbVar6 = pbVar6 + lVar4) {
          if (lVar10 < 0xccccccccccccccb) {
            lVar10 = lVar10 * 10 + (long)(char)*pbVar6 + -0x30;
            iVar16 = iVar16 + -1;
          }
          iVar12 = iVar12 + 1;
        }
      }
      if (pbVar9 <= pbVar13) goto LAB_001286bd;
      if ((*pbVar13 | 0x20) == 0x65) {
        pbVar13 = pbVar13 + lVar4;
        if (pbVar13 < pbVar9) {
          local_6c = 1;
          if (*pbVar13 == 0x2b) {
            pbVar13 = pbVar13 + lVar4;
          }
          else if (*pbVar13 == 0x2d) {
            pbVar13 = pbVar13 + lVar4;
            local_6c = -1;
          }
          iVar15 = 0;
          bVar7 = false;
          for (; (pbVar13 < pbVar9 && (0xfffffffffffffff5 < (ulong)*pbVar13 - 0x3a));
              pbVar13 = pbVar13 + lVar4) {
            bVar7 = 9999 < iVar15;
            iVar15 = iVar15 * 10 + -0x30 + (int)(char)*pbVar13;
            if (bVar7) {
              iVar15 = 10000;
            }
            bVar7 = true;
          }
          goto LAB_001288e1;
        }
        iVar15 = 0;
        local_6c = 1;
        bVar7 = false;
      }
      else {
        bVar7 = true;
        iVar15 = 0;
        local_6c = 1;
LAB_001288e1:
        while ((pbVar13 < pbVar9 && ((""[*pbVar13] & 1) != 0))) {
          pbVar13 = pbVar13 + lVar4;
        }
      }
      goto LAB_001286c8;
    }
    iVar16 = iVar16 + 1;
    pbVar6 = pbVar6 + lVar4;
  }
  iVar12 = iVar12 + iVar16;
LAB_001286bd:
  bVar7 = true;
  iVar15 = 0;
  local_6c = 1;
LAB_001286c8:
  if (lVar10 == 0) {
    if (bVar1 == 0x2d) {
      dVar17 = -0.0;
    }
    else {
      dVar17 = 0.0;
    }
  }
  else {
    uVar14 = iVar15 * local_6c + iVar16;
    uVar5 = -uVar14;
    if (0 < (int)uVar14) {
      uVar5 = uVar14;
    }
    for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
      if ((int)uVar14 < 0) {
        lVar4 = lVar10 / 10;
        if (lVar10 % 10 != 0) goto LAB_0012873c;
      }
      else {
        if (0xccccccccccccccb < lVar10) {
LAB_0012873c:
          lVar4 = -lVar10;
          if (bVar1 != 0x2d) {
            lVar4 = lVar10;
          }
          if (uVar5 < 0x134) goto LAB_0012877d;
          if (uVar5 < 0x156) {
            fVar3 = 1.0;
            for (; (int)uVar5 % 0x134 != 0; uVar5 = uVar5 - 1) {
              fVar3 = fVar3 * 10.0;
            }
            if ((int)uVar14 < 0) {
              dVar17 = (double)((float)lVar4 / fVar3) / 1e+308;
            }
            else {
              dVar17 = (double)((float)lVar4 * fVar3) * 1e+308;
            }
          }
          else if ((int)uVar14 < 0) {
            dVar17 = (double)((ulong)(double)lVar4 & 0x8000000000000000);
          }
          else {
            dVar17 = (double)lVar4 * INFINITY;
          }
          goto LAB_00128859;
        }
        lVar4 = lVar10 * 10;
      }
      lVar10 = lVar4;
    }
    lVar4 = -lVar10;
    if (bVar1 != 0x2d) {
      lVar4 = lVar10;
    }
    if (uVar5 == 0) {
      dVar17 = (double)lVar4;
    }
    else {
LAB_0012877d:
      fVar3 = 1.0;
      for (; (int)uVar5 % 0x16 != 0; uVar5 = uVar5 - 1) {
        fVar3 = fVar3 * 10.0;
      }
      for (; 0 < (int)uVar5; uVar5 = uVar5 - 0x16) {
        fVar3 = fVar3 * 1e+22;
      }
      if ((int)uVar14 < 0) {
        dVar17 = (double)((float)lVar4 / fVar3);
      }
      else {
        dVar17 = (double)((float)lVar4 * fVar3);
      }
    }
  }
LAB_00128859:
  if (iVar12 < 1) {
    uVar11 = 0;
  }
  if (pbVar13 != pbVar9) {
    uVar11 = 0;
  }
  *pResult = dVar17;
  if (bVar7) {
    return uVar11;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr, nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          while( e%308 ) { scale *= 1.0e+1; e -= 1; }
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
            result = 1e308*1e308*s;  /* Infinity */
          }
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}